

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O2

void __thiscall
BIP324Cipher::Initialize
          (BIP324Cipher *this,EllSwiftPubKey *their_pubkey,bool initiator,bool self_decrypt)

{
  long lVar1;
  CChainParams *pCVar2;
  array<std::byte,_16UL> *paVar3;
  BIP324Cipher *pBVar4;
  optional<FSChaCha20Poly1305> *poVar5;
  bool bVar6;
  long in_FS_OFFSET;
  allocator<char> local_d9;
  string local_d8;
  array<std::byte,_32UL> hkdf_32_okm;
  CHKDF_HMAC_SHA256_L32 hkdf;
  ECDHSecret ecdh_secret;
  string salt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = Params();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ecdh_secret,"bitcoin_v2_shared_secret",(allocator<char> *)&hkdf_32_okm);
  hkdf.m_prk._0_8_ = hkdf.m_prk + 0x10;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&hkdf,&pCVar2->pchMessageStart,&pCVar2->nDefaultPort);
  std::operator+(&salt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ecdh_secret,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hkdf);
  std::__cxx11::string::~string((string *)&hkdf);
  std::__cxx11::string::~string((string *)&ecdh_secret);
  CKey::ComputeBIP324ECDHSecret
            (&ecdh_secret,&this->m_key,their_pubkey,&this->m_our_pubkey,initiator);
  CHKDF_HMAC_SHA256_L32::CHKDF_HMAC_SHA256_L32(&hkdf,ecdh_secret._M_elems,0x20,&salt);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"initiator_L",&local_d9);
  CHKDF_HMAC_SHA256_L32::Expand32(&hkdf,&local_d8,hkdf_32_okm._M_elems);
  bVar6 = self_decrypt != initiator;
  std::__cxx11::string::~string((string *)&local_d8);
  pBVar4 = (BIP324Cipher *)&this->m_recv_l_cipher;
  if (bVar6) {
    pBVar4 = this;
  }
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (&pBVar4->m_send_l_cipher,&hkdf_32_okm,&REKEY_INTERVAL);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"initiator_P",&local_d9);
  CHKDF_HMAC_SHA256_L32::Expand32(&hkdf,&local_d8,hkdf_32_okm._M_elems);
  std::__cxx11::string::~string((string *)&local_d8);
  poVar5 = &this->m_recv_p_cipher;
  if (bVar6) {
    poVar5 = &this->m_send_p_cipher;
  }
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (poVar5,&hkdf_32_okm,&REKEY_INTERVAL);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"responder_L",&local_d9);
  CHKDF_HMAC_SHA256_L32::Expand32(&hkdf,&local_d8,hkdf_32_okm._M_elems);
  std::__cxx11::string::~string((string *)&local_d8);
  pBVar4 = (BIP324Cipher *)&this->m_recv_l_cipher;
  if (!bVar6) {
    pBVar4 = this;
  }
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (&pBVar4->m_send_l_cipher,&hkdf_32_okm,&REKEY_INTERVAL);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"responder_P",&local_d9);
  CHKDF_HMAC_SHA256_L32::Expand32(&hkdf,&local_d8,hkdf_32_okm._M_elems);
  std::__cxx11::string::~string((string *)&local_d8);
  poVar5 = &this->m_send_p_cipher;
  if (bVar6) {
    poVar5 = &this->m_recv_p_cipher;
  }
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (poVar5,&hkdf_32_okm,&REKEY_INTERVAL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"garbage_terminators",&local_d9);
  CHKDF_HMAC_SHA256_L32::Expand32(&hkdf,&local_d8,hkdf_32_okm._M_elems);
  std::__cxx11::string::~string((string *)&local_d8);
  paVar3 = &this->m_recv_garbage_terminator;
  if (initiator) {
    paVar3 = &this->m_send_garbage_terminator;
  }
  *(undefined8 *)paVar3->_M_elems = hkdf_32_okm._M_elems._0_8_;
  *(undefined8 *)(paVar3->_M_elems + 8) = hkdf_32_okm._M_elems._8_8_;
  paVar3 = &this->m_send_garbage_terminator;
  if (initiator) {
    paVar3 = &this->m_recv_garbage_terminator;
  }
  *(undefined8 *)paVar3->_M_elems = hkdf_32_okm._M_elems._16_8_;
  *(undefined8 *)(paVar3->_M_elems + 8) = hkdf_32_okm._M_elems._24_8_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"session_id",&local_d9);
  CHKDF_HMAC_SHA256_L32::Expand32(&hkdf,&local_d8,(this->m_session_id)._M_elems);
  std::__cxx11::string::~string((string *)&local_d8);
  memory_cleanse(&ecdh_secret,0x20);
  memory_cleanse(&hkdf_32_okm,0x20);
  memory_cleanse(&hkdf,0x20);
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  CKey::operator=(&this->m_key,(CKey *)&local_d8);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 *)&local_d8._M_string_length);
  std::__cxx11::string::~string((string *)&salt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BIP324Cipher::Initialize(const EllSwiftPubKey& their_pubkey, bool initiator, bool self_decrypt) noexcept
{
    // Determine salt (fixed string + network magic bytes)
    const auto& message_header = Params().MessageStart();
    std::string salt = std::string{"bitcoin_v2_shared_secret"} + std::string(std::begin(message_header), std::end(message_header));

    // Perform ECDH to derive shared secret.
    ECDHSecret ecdh_secret = m_key.ComputeBIP324ECDHSecret(their_pubkey, m_our_pubkey, initiator);

    // Derive encryption keys from shared secret, and initialize stream ciphers and AEADs.
    bool side = (initiator != self_decrypt);
    CHKDF_HMAC_SHA256_L32 hkdf(UCharCast(ecdh_secret.data()), ecdh_secret.size(), salt);
    std::array<std::byte, 32> hkdf_32_okm;
    hkdf.Expand32("initiator_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_l_cipher : m_recv_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("initiator_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_p_cipher : m_recv_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_l_cipher : m_send_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_p_cipher : m_send_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);

    // Derive garbage terminators from shared secret.
    hkdf.Expand32("garbage_terminators", UCharCast(hkdf_32_okm.data()));
    std::copy(std::begin(hkdf_32_okm), std::begin(hkdf_32_okm) + GARBAGE_TERMINATOR_LEN,
        (initiator ? m_send_garbage_terminator : m_recv_garbage_terminator).begin());
    std::copy(std::end(hkdf_32_okm) - GARBAGE_TERMINATOR_LEN, std::end(hkdf_32_okm),
        (initiator ? m_recv_garbage_terminator : m_send_garbage_terminator).begin());

    // Derive session id from shared secret.
    hkdf.Expand32("session_id", UCharCast(m_session_id.data()));

    // Wipe all variables that contain information which could be used to re-derive encryption keys.
    memory_cleanse(ecdh_secret.data(), ecdh_secret.size());
    memory_cleanse(hkdf_32_okm.data(), sizeof(hkdf_32_okm));
    memory_cleanse(&hkdf, sizeof(hkdf));
    m_key = CKey();
}